

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

string * __thiscall cpptempl::DataValue::getvalue_abi_cxx11_(DataValue *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

inline std::string DataValue::getvalue()
    {
        return m_value ;
    }